

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinSubstr
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  HeapEntity *pHVar1;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  const_reference pvVar2;
  ulong uVar3;
  long lVar4;
  ostream *poVar5;
  undefined8 uVar6;
  size_type sVar7;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this_00;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *pbVar8;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_RDX;
  long in_RDI;
  Value VVar9;
  stringstream ss_1;
  stringstream ss;
  long len;
  long from;
  HeapString *str;
  UString *in_stack_fffffffffffffaf8;
  Interpreter *in_stack_fffffffffffffb00;
  Interpreter *this_01;
  Interpreter *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  allocator_type *in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb34;
  iterator in_stack_fffffffffffffb38;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined1 local_468 [103];
  undefined1 local_401;
  stringstream local_3e0 [16];
  ostream local_3d0 [383];
  undefined1 local_251;
  stringstream local_230 [16];
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *in_stack_fffffffffffffde0;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *in_stack_fffffffffffffde8;
  string *in_stack_fffffffffffffdf0;
  LocationRange *in_stack_fffffffffffffdf8;
  Interpreter *in_stack_fffffffffffffe00;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 *local_80;
  undefined8 local_78;
  allocator<char> local_41;
  string local_40 [32];
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *local_20;
  
  local_20 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb40,(char *)in_stack_fffffffffffffb38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30));
  local_8c = 0x13;
  local_88 = 2;
  local_84 = 2;
  local_80 = &local_8c;
  local_78 = 3;
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d9971);
  __l._M_len = (size_type)in_stack_fffffffffffffb40;
  __l._M_array = in_stack_fffffffffffffb38;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)CONCAT44(in_stack_fffffffffffffb34,in_stack_fffffffffffffb30),__l,
           in_stack_fffffffffffffb28);
  validateBuiltinArgs(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                      in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
             *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>::~allocator
            ((allocator<jsonnet::internal::(anonymous_namespace)::Value::Type> *)0x2d99de);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,0);
  pHVar1 = (pvVar2->v).h;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,1);
  uVar3 = (ulong)(pvVar2->v).d;
  pvVar2 = std::
           vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           ::operator[](local_20,2);
  lVar4 = (long)(pvVar2->v).d;
  if ((long)uVar3 < 0) {
    std::__cxx11::stringstream::stringstream(local_230);
    poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffde0,
                             "substr second parameter should be greater than zero, got ");
    std::ostream::operator<<(poVar5,uVar3);
    local_251 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(in_stack_fffffffffffffb08,(LocationRange *)in_stack_fffffffffffffb00,
              (string *)in_stack_fffffffffffffaf8);
    local_251 = 0;
    __cxa_throw(uVar6,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  if (lVar4 < 0) {
    std::__cxx11::stringstream::stringstream(local_3e0);
    poVar5 = std::operator<<(local_3d0,"substr third parameter should be greater than zero, got ");
    std::ostream::operator<<(poVar5,lVar4);
    local_401 = 1;
    uVar6 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    makeError(in_stack_fffffffffffffb08,(LocationRange *)in_stack_fffffffffffffb00,
              (string *)in_stack_fffffffffffffaf8);
    local_401 = 0;
    __cxa_throw(uVar6,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  uVar10 = uVar3;
  sVar7 = std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                    ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)(pHVar1 + 1));
  if (sVar7 < uVar10) {
    std::__cxx11::u32string::u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
    VVar9 = makeString(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_468._88_8_ = VVar9.v;
    local_468._80_4_ = VVar9.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(local_468._84_4_,local_468._80_4_);
    *(undefined8 *)(in_RDI + 0x48) = local_468._88_8_;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_stack_fffffffffffffb00);
  }
  else {
    this_00 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
              (lVar4 + uVar3);
    pbVar8 = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::size
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)(pHVar1 + 1));
    if (pbVar8 < this_00) {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      size((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
           (pHVar1 + 1));
    }
    this_01 = (Interpreter *)local_468;
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    substr(this_00,CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
           (size_type)in_stack_fffffffffffffb08);
    VVar9 = makeString(this_01,in_stack_fffffffffffffaf8);
    local_468._40_8_ = VVar9.v;
    local_468._32_4_ = VVar9.t;
    *(ulong *)(in_RDI + 0x40) = CONCAT44(local_468._36_4_,local_468._32_4_);
    *(undefined8 *)(in_RDI + 0x48) = local_468._40_8_;
    std::__cxx11::u32string::~u32string
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               this_01);
  }
  return (AST *)0x0;
}

Assistant:

const AST *builtinSubstr(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "substr", args, {Value::STRING, Value::NUMBER, Value::NUMBER});
        const auto *str = static_cast<const HeapString *>(args[0].v.h);
        long from = long(args[1].v.d);
        long len = long(args[2].v.d);
        if (from < 0) {
            std::stringstream ss;
            ss << "substr second parameter should be greater than zero, got " << from;
            throw makeError(loc, ss.str());
        }
        if (len < 0) {
            std::stringstream ss;
            ss << "substr third parameter should be greater than zero, got " << len;
            throw makeError(loc, ss.str());
        }
        if (static_cast<unsigned long>(from) > str->value.size()) {
            scratch = makeString(UString());
            return nullptr;
        }
        if (size_t(len + from) > str->value.size()) {
          len = str->value.size() - from;
        }
        scratch = makeString(str->value.substr(from, len));
        return nullptr;
    }